

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void __thiscall NetworkNS::Network::Network(Network *this,NetwMin *netw_min,string *filename)

{
  list<sNode,_std::allocator<sNode>_> *this_00;
  size_t *psVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  iterator __position;
  _List_node_base *p_Var5;
  long *plVar6;
  pointer plVar7;
  pointer pbVar8;
  undefined8 uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  tNode *temp;
  undefined4 extraout_var;
  ostream *poVar15;
  _Node *p_Var16;
  _Node *p_Var17;
  _List_node_base *p_Var18;
  _List_node_base *p_Var19;
  double dVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  double dVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  pointer pcVar29;
  pointer pcVar30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  double dyr;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  chains;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  double dzr;
  ifstream data_file;
  ulong local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  double local_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  size_t *local_440;
  ulong local_438;
  _List_node_base *local_430;
  uint local_424;
  long local_420;
  Network *local_418;
  vector<sBead_type,_std::allocator<sBead_type>_> *local_410;
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  *local_408;
  vector<sBond_type,_std::allocator<sBond_type>_> *local_400;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d8;
  pointer piStack_3d0;
  pointer local_3c8;
  pointer ppsStack_3c0;
  pointer local_3b8;
  pointer ppsStack_3b0;
  pointer local_3a8;
  pointer piStack_3a0;
  pointer local_398;
  pointer ppsStack_390;
  pointer local_388;
  pointer ppsStack_380;
  int local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  long local_330;
  double local_328;
  string local_320;
  NetwMin *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  this->_vptr_Network = (_func_int **)&PTR__Network_0010fd58;
  this_00 = &this->nodes;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node._M_size = 0;
  local_430 = (_List_node_base *)&this->strands;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_prev = local_430;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node.
  super__List_node_base._M_next = local_430;
  (this->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl._M_node._M_size = 0;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->subchains;
  (this->subchains).
  super__List_base<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->pslip_springs;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->pslip_springs;
  local_410 = &this->node_types;
  local_400 = &this->bond_types;
  local_408 = &this->sorted_chains;
  (this->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_types).super__Vector_base<sBead_type,_std::allocator<sBead_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bond_types).super__Vector_base<sBond_type,_std::allocator<sBond_type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_chains).
  super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418 = this;
  local_300 = netw_min;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Initializing network.\n",0x19);
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438 = 0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_420 = 2;
  lVar21 = 0;
  lVar27 = 0;
  lVar24 = 0;
  local_440 = (size_t *)0x0;
  local_330 = 2;
  local_424 = 0;
  dVar25 = 0.0;
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_460 = 0.0;
    local_424 = 0;
    iVar14 = 0;
    iVar23 = 0;
    iVar13 = 0;
    iVar22 = 0;
    local_420 = 0;
    local_440 = (size_t *)0x0;
    local_438 = 0;
    iVar26 = 0;
    do {
      local_3f8._0_8_ = &local_3e8;
      local_3f8._8_8_ = (pointer)0x0;
      local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffffffffff00;
      cVar10 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                               (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)local_3f8,cVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_348,(value_type *)local_3f8);
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c995,0);
      if (lVar21 != -1) {
        iVar11 = atoi((char *)local_3f8._0_8_);
        local_460 = (double)CONCAT44(extraout_var,iVar11);
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c99b,0);
      if (lVar21 != -1) {
        local_424 = atoi((char *)local_3f8._0_8_);
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9a1,0);
      if (lVar21 != -1) {
        iVar14 = iVar26;
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9a7,0);
      if (lVar21 != -1) {
        iVar23 = iVar26;
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9ad,0);
      if (lVar21 != -1) {
        iVar22 = iVar26;
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9b4,0);
      if ((lVar21 != -1) &&
         (lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9b9,0), lVar21 != -1)) {
        iVar13 = iVar26;
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9c0,0);
      if (lVar21 != -1) {
        lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9b9,0);
        iVar11 = (int)local_420;
        if (lVar21 != -1) {
          iVar11 = iVar26;
        }
        local_420 = CONCAT44(local_420._4_4_,iVar11);
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9c5,0);
      if (lVar21 != -1) {
        lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9ca,0);
        iVar11 = (int)local_440;
        if (lVar21 != -1) {
          iVar11 = iVar26;
        }
        local_440 = (size_t *)CONCAT44(local_440._4_4_,iVar11);
      }
      lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9d0,0);
      if (lVar21 != -1) {
        lVar21 = std::__cxx11::string::find((char *)local_3f8,0x10c9ca,0);
        iVar11 = (int)local_438;
        if (lVar21 != -1) {
          iVar11 = iVar26;
        }
        local_438 = CONCAT44(local_438._4_4_,iVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      iVar26 = iVar26 + 1;
    } while (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0);
    lVar21 = (long)(int)local_440;
    lVar24 = (long)iVar22;
    lVar27 = (long)(int)local_420;
    local_438 = (ulong)(int)local_438;
    local_440 = (size_t *)(long)iVar13;
    local_330 = (long)(iVar14 + 2);
    local_420 = (long)(iVar23 + 2);
    dVar25 = local_460;
  }
  std::ifstream::close();
  pcVar29 = local_348.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar29,
             pcVar29 + local_348.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_string_length);
  tokenize(&local_458,&local_258);
  local_3e8._M_allocated_capacity =
       (size_type)
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3f8._8_8_ =
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f8._0_8_ =
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  uVar12 = atoi((char *)((local_478.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- Number of bead types: ",0x1d);
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," .\n",3);
  std::vector<sBead_type,_std::allocator<sBead_type>_>::resize(local_410,(long)(int)uVar12);
  local_460 = dVar25;
  if (0 < (int)uVar12) {
    lVar27 = lVar27 << 5;
    lVar24 = lVar24 << 5;
    lVar21 = 0;
    do {
      lVar2 = *(long *)((long)&local_348.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p +
                       lVar24);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,lVar2,
                 *(long *)((long)&local_348.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length +
                          lVar24) + lVar2);
      tokenize(&local_458,&local_278);
      local_3e8._M_allocated_capacity =
           (size_type)
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3f8._8_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3f8._0_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar25 = atof((char *)local_478.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      psVar3 = (local_410->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)&psVar3->n_mass + lVar21) = dVar25;
      dVar25 = atof((char *)pbVar8[2]._M_dataplus._M_p);
      *(double *)((long)&psVar3->mass + lVar21) = dVar25;
      lVar2 = *(long *)((long)&local_348.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p +
                       lVar27);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,lVar2,
                 *(long *)((long)&local_348.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length +
                          lVar27) + lVar2);
      tokenize(&local_458,&local_298);
      dVar25 = local_460;
      local_3e8._M_allocated_capacity =
           (size_type)
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3f8._8_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3f8._0_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      dVar20 = atof((char *)local_478.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      *(double *)
       ((long)&((local_410->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
                super__Vector_impl_data._M_start)->r_node + lVar21) = dVar20;
      lVar27 = lVar27 + 0x20;
      lVar24 = lVar24 + 0x20;
      lVar21 = lVar21 + 0x18;
    } while ((ulong)uVar12 * 0x18 != lVar21);
  }
  pcVar29 = local_348.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_438]._M_dataplus._M_p;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar29,
             pcVar29 + local_348.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_438]._M_string_length);
  tokenize(&local_458,&local_2b8);
  local_3e8._M_allocated_capacity =
       (size_type)
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3f8._8_8_ =
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3f8._0_8_ =
       local_478.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_458.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  uVar12 = atoi((char *)((local_478.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: --- Number of bond types: ",0x1d);
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," .\n",3);
  std::vector<sBond_type,_std::allocator<sBond_type>_>::resize(local_400,(long)(int)uVar12);
  if (0 < (int)uVar12) {
    lVar24 = (long)local_440 * 0x20 + 0x48;
    lVar21 = 0;
    do {
      lVar27 = *(long *)((long)local_348.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,lVar27,
                 *(long *)((long)&((local_348.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar24) + lVar27);
      tokenize(&local_458,&local_2d8);
      local_3e8._M_allocated_capacity =
           (size_type)
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3f8._8_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3f8._0_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar25 = atof((char *)local_478.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      psVar4 = (local_400->super__Vector_base<sBond_type,_std::allocator<sBond_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)&psVar4->spring_coeff + lVar21) = dVar25;
      dVar25 = atof((char *)pbVar8[2]._M_dataplus._M_p);
      *(double *)((long)&psVar4->sq_ete + lVar21) = dVar25;
      dVar25 = atof((char *)pbVar8[3]._M_dataplus._M_p);
      *(double *)((long)&psVar4->kuhnl + lVar21) = dVar25;
      lVar24 = lVar24 + 0x20;
      lVar21 = lVar21 + 0x18;
      dVar25 = local_460;
    } while ((ulong)uVar12 * 0x18 != lVar21);
  }
  iVar13 = SUB84(dVar25,0);
  if (0 < iVar13) {
    uVar28 = (ulong)dVar25 & 0xffffffff;
    lVar21 = local_330 << 5;
    do {
      lVar24 = *(long *)((long)&((local_348.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar21);
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,lVar24,
                 *(long *)((long)&(local_348.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                          lVar21) + lVar24);
      tokenize(&local_458,&local_2f8);
      local_3e8._M_allocated_capacity =
           (size_type)
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3f8._8_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3f8._0_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_388 = (pointer)0x0;
      ppsStack_380 = (pointer)0x0;
      local_398 = (pointer)0x0;
      ppsStack_390 = (pointer)0x0;
      local_3a8 = (pointer)0x0;
      piStack_3a0 = (pointer)0x0;
      local_3b8 = (pointer)0x0;
      ppsStack_3b0 = (pointer)0x0;
      local_3c8 = (pointer)0x0;
      ppsStack_3c0 = (pointer)0x0;
      local_3d8 = (pointer)0x0;
      piStack_3d0 = (pointer)0x0;
      iVar13 = atoi((char *)((local_478.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      local_3f8._0_4_ = iVar13;
      iVar13 = atoi((char *)pbVar8[2]._M_dataplus._M_p);
      local_3f8._4_4_ = iVar13;
      local_3f8._8_8_ = atof((char *)pbVar8[4]._M_dataplus._M_p);
      local_3e8._M_allocated_capacity = (size_type)atof((char *)pbVar8[5]._M_dataplus._M_p);
      local_3e8._8_8_ = atof((char *)pbVar8[6]._M_dataplus._M_p);
      local_378 = 0;
      psVar3 = (local_410->super__Vector_base<sBead_type,_std::allocator<sBead_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_370 = psVar3[(long)iVar13 + -1].n_mass;
      local_368 = psVar3[(long)iVar13 + -1].mass;
      local_360 = psVar3[(long)iVar13 + -1].r_node;
      local_358 = local_360;
      p_Var16 = std::__cxx11::list<sNode,std::allocator<sNode>>::_M_create_node<sNode_const&>
                          ((list<sNode,std::allocator<sNode>> *)this_00,(sNode *)local_3f8);
      std::__detail::_List_node_base::_M_hook(&p_Var16->super__List_node_base);
      psVar1 = &(local_418->nodes).super__List_base<sNode,_std::allocator<sNode>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      if (ppsStack_390 != (pointer)0x0) {
        operator_delete(ppsStack_390,(long)ppsStack_380 - (long)ppsStack_390);
      }
      iVar13 = SUB84(local_460,0);
      if (local_3a8 != (pointer)0x0) {
        operator_delete(local_3a8,(long)local_398 - (long)local_3a8);
      }
      if (ppsStack_3c0 != (pointer)0x0) {
        operator_delete(ppsStack_3c0,(long)ppsStack_3b0 - (long)ppsStack_3c0);
      }
      if (local_3d8 != (pointer)0x0) {
        operator_delete(local_3d8,(long)local_3c8 - (long)local_3d8);
      }
      lVar21 = lVar21 + 0x20;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#: --- ",7);
  poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar15," nodes have been added to the network structure.\n",0x31);
  local_480 = 0;
  if (0 < (int)local_424) {
    local_440 = &(local_418->pslip_springs).super__List_base<sStrand_*,_std::allocator<sStrand_*>_>.
                 _M_impl._M_node._M_size;
    local_438 = (ulong)local_424;
    uVar28 = 0;
    do {
      lVar21 = local_420 + uVar28;
      pcVar29 = local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_dataplus._M_p;
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,pcVar29,
                 pcVar29 + local_348.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_string_length);
      tokenize(&local_458,&local_320);
      local_3e8._M_allocated_capacity =
           (size_type)
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3f8._8_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3f8._0_8_ =
           local_478.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      pbVar8 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3c8 = (pointer)0x0;
      ppsStack_3c0 = (pointer)0x0;
      local_3b8 = (pointer)0x0;
      iVar13 = atoi((char *)((local_478.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      local_3f8._0_4_ = iVar13;
      iVar13 = atoi((char *)pbVar8[1]._M_dataplus._M_p);
      local_3f8._4_4_ = iVar13;
      uVar12 = atoi((char *)pbVar8[5]._M_dataplus._M_p);
      if ((int)local_480 < (int)uVar12) {
        local_480 = (ulong)uVar12;
      }
      if (uVar12 == 0) {
        local_3f8._8_5_ = 0x100000000;
      }
      else {
        local_3f8[0xc] = 0;
        local_3f8._8_4_ = uVar12;
      }
      iVar13 = atoi((char *)pbVar8[2]._M_dataplus._M_p);
      iVar14 = atoi((char *)pbVar8[3]._M_dataplus._M_p);
      if ((SUB84(local_460,0) < iVar13) || (SUB84(local_460,0) < iVar14)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,": --- There is a problem at line: ",0x22);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar21 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," of the data file.\n",0x13);
        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_348.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_dataplus.
                                     _M_p,
                             local_348.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar21]._M_string_length);
        std::operator<<(poVar15,"\n");
        exit(0);
      }
      p_Var19 = (this_00->super__List_base<sNode,_std::allocator<sNode>_>)._M_impl._M_node.
                super__List_node_base._M_next;
      if (p_Var19 != (_List_node_base *)this_00) {
        iVar23 = 0;
        do {
          if ((*(int *)&p_Var19[1]._M_next == iVar13) || (*(int *)&p_Var19[1]._M_next == iVar14)) {
            __position._M_current = (int *)p_Var19[3]._M_prev;
            if ((_List_node_base *)__position._M_current == p_Var19[4]._M_next) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)(p_Var19 + 3),__position,
                         (int *)(local_3f8 + 8));
            }
            else {
              *__position._M_current = local_3f8._8_4_;
              p_Var19[3]._M_prev = (_List_node_base *)(__position._M_current + 1);
            }
            local_458.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var19 + 1);
            std::vector<sNode*,std::allocator<sNode*>>::emplace_back<sNode*>
                      ((vector<sNode*,std::allocator<sNode*>> *)&local_3c8,(sNode **)&local_458);
            iVar23 = iVar23 + 1;
          }
          p_Var19 = p_Var19->_M_next;
        } while ((p_Var19 != (_List_node_base *)this_00) && (iVar23 < 2));
      }
      lVar21 = (long)(int)local_3f8._4_4_;
      psVar4 = (local_400->super__Vector_base<sBond_type,_std::allocator<sBond_type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_3e8._8_8_ = psVar4[lVar21 + -1].spring_coeff;
      local_3d8 = (pointer)psVar4[lVar21 + -1].sq_ete;
      piStack_3d0 = (pointer)psVar4[lVar21 + -1].kuhnl;
      if ((bool)local_3f8[0xc] == true) {
        local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffff00000000;
      }
      p_Var17 = std::__cxx11::list<sStrand,std::allocator<sStrand>>::_M_create_node<sStrand_const&>
                          ((list<sStrand,std::allocator<sStrand>> *)local_430,(sStrand *)local_3f8);
      std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
      psVar1 = &(local_418->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((bool)local_3f8[0xc] == true) {
        p_Var19 = (local_418->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl.
                  _M_node.super__List_node_base._M_prev;
        p_Var18 = (_List_node_base *)operator_new(0x18);
        p_Var18[1]._M_next = p_Var19 + 1;
        std::__detail::_List_node_base::_M_hook(p_Var18);
        *local_440 = *local_440 + 1;
      }
      if (local_3c8 != (pointer)0x0) {
        operator_delete(local_3c8,(long)local_3b8 - (long)local_3c8);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_438);
  }
  p_Var19 = local_430->_M_next;
  if (p_Var19 != local_430) {
    do {
      if (*(undefined1 *)((long)&p_Var19[1]._M_prev + 4) == '\0') {
        local_3f8._0_8_ = p_Var19 + 1;
        std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                  ((vector<sStrand*,std::allocator<sStrand*>> *)
                   ((long)((p_Var19[4]._M_next)->_M_next + 3) + 8),(sStrand **)local_3f8);
        local_3f8._0_8_ = p_Var19 + 1;
        std::vector<sStrand*,std::allocator<sStrand*>>::emplace_back<sStrand*>
                  ((vector<sStrand*,std::allocator<sStrand*>> *)
                   &(p_Var19[4]._M_next)->_M_prev[3]._M_prev,(sStrand **)local_3f8);
      }
      p_Var19 = p_Var19->_M_next;
    } while (p_Var19 != local_430);
  }
  p_Var19 = local_430->_M_next;
  if (p_Var19 != local_430) {
    do {
      if (*(undefined1 *)((long)&p_Var19[1]._M_prev + 4) == '\0') {
        p_Var18 = p_Var19[4]._M_next;
        p_Var5 = p_Var18->_M_prev;
        local_3f8._0_8_ = (double)p_Var5->_M_prev - (double)p_Var18->_M_next->_M_prev;
        local_458.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)p_Var5[1]._M_next - (double)p_Var18->_M_next[1]._M_next);
        local_328 = (double)p_Var5[1]._M_prev -
                    (double)*(_List_node_base **)((long)(p_Var18->_M_next + 1) + 8);
        Domain::minimum_image(local_300->domain,(double *)local_3f8,(double *)&local_458,&local_328)
        ;
        dVar25 = local_328 * local_328 +
                 (double)local_3f8._0_8_ * (double)local_3f8._0_8_ +
                 (double)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start *
                 (double)local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        if (dVar25 < 0.0) {
          local_460 = sqrt(dVar25);
        }
        else {
          local_460 = SQRT(dVar25);
        }
        if (0.0001 < local_460 - (double)p_Var19[3]._M_next / (double)p_Var19[3]._M_prev) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Strand ",7);
          poVar15 = (ostream *)
                    std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var19[1]._M_next);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," has length ",0xc);
          poVar15 = std::ostream::_M_insert<double>
                              ((double)p_Var19[3]._M_next / (double)p_Var19[3]._M_prev);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," but real dist ",0xf);
          poVar15 = std::ostream::_M_insert<double>(local_460);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
        }
      }
      p_Var19 = p_Var19->_M_next;
    } while (p_Var19 != local_430);
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
            *)local_3f8,local_480,(allocator_type *)&local_458);
  p_Var19 = (((_List_base<sStrand,_std::allocator<sStrand>_> *)&local_430->_M_next)->_M_impl).
            _M_node.super__List_node_base._M_next;
  if (p_Var19 != local_430) {
    do {
      uVar9 = local_3f8._0_8_;
      if (*(undefined1 *)((long)&p_Var19[1]._M_prev + 4) == '\0') {
        iVar13 = *(int *)&p_Var19[1]._M_prev;
        p_Var18 = (_List_node_base *)operator_new(0x18);
        p_Var18[1]._M_next = p_Var19 + 1;
        std::__detail::_List_node_base::_M_hook(p_Var18);
        *(long *)(uVar9 + (long)iVar13 * 0x18 + -8) =
             *(long *)(uVar9 + (long)iVar13 * 0x18 + -8) + 1;
      }
      p_Var19 = p_Var19->_M_next;
    } while (p_Var19 != local_430);
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::resize(local_408,local_480);
  if (local_3f8._8_8_ != local_3f8._0_8_) {
    dVar25 = 0.0;
    do {
      pcVar29 = (pointer)(local_3f8._0_8_ + (long)dVar25 * 0x18);
      pcVar30 = *(pointer *)pcVar29;
      while (((pcVar30 != pcVar29 &&
              (*(int *)(**(long **)(*(long *)(pcVar30 + 0x10) + 0x30) + 4) != 1)) &&
             (*(int *)((*(long **)(*(long *)(pcVar30 + 0x10) + 0x30))[1] + 4) != 1))) {
        pcVar30 = *(pointer *)pcVar30;
      }
      local_460 = dVar25;
      if (pcVar30 == pcVar29) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Chain with no ends was found: ",0x1e);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," .\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Number of strands: ",0x13);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        iVar13 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," .\n",3);
      }
      else {
        plVar6 = *(long **)(*(long *)(pcVar30 + 0x10) + 0x30);
        lVar21 = *plVar6;
        if (*(int *)(lVar21 + 4) != 1) {
          *plVar6 = plVar6[1];
          *(long *)(*(long *)(*(long *)(pcVar30 + 0x10) + 0x30) + 8) = lVar21;
        }
        plVar7 = (local_408->
                 super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        p_Var19 = (_List_node_base *)operator_new(0x18);
        lVar21 = (long)dVar25 * 0x18;
        p_Var19[1]._M_next = *(_List_node_base **)(pcVar30 + 0x10);
        std::__detail::_List_node_base::_M_hook(p_Var19);
        psVar1 = (size_t *)
                 ((long)&plVar7[(long)dVar25].
                         super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl._M_node +
                 0x10);
        *psVar1 = *psVar1 + 1;
        iVar13 = 0x1e;
        if (1 < *(ulong *)(local_3f8._0_8_ + lVar21 + 0x10)) {
          *(ulong *)(local_3f8._0_8_ + lVar21 + 0x10) =
               *(ulong *)(local_3f8._0_8_ + lVar21 + 0x10) - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(pcVar30,0x18);
          iVar13 = *(int *)(local_3f8._0_8_ + (long)dVar25 * 0x18 + 0x10);
          if (0 < iVar13) {
            iVar14 = 0;
            do {
              plVar7 = (local_408->
                       super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcVar29 = (pointer)(local_3f8._0_8_ + lVar21);
              do {
                pcVar29 = *(pointer *)pcVar29;
                if (pcVar29 == (pointer)(local_3f8._0_8_ + lVar21)) goto LAB_00109351;
                plVar6 = *(long **)(*(long *)(pcVar29 + 0x10) + 0x30);
                p_Var19 = (_List_node_base *)*plVar6;
                p_Var18 = ((*(_List_node_base **)
                             ((long)&plVar7[(long)dVar25].
                                     super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl
                                     ._M_node + 8))[1]._M_next[3]._M_next)->_M_prev;
                if (p_Var19 == p_Var18) {
                  p_Var19 = (_List_node_base *)operator_new(0x18);
                  goto LAB_00109318;
                }
              } while ((_List_node_base *)plVar6[1] != p_Var18);
              *plVar6 = plVar6[1];
              *(_List_node_base **)(*(long *)(*(long *)(pcVar29 + 0x10) + 0x30) + 8) = p_Var19;
              plVar7 = (local_408->
                       super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              p_Var19 = (_List_node_base *)operator_new(0x18);
LAB_00109318:
              p_Var19[1]._M_next = *(_List_node_base **)(pcVar29 + 0x10);
              std::__detail::_List_node_base::_M_hook(p_Var19);
              psVar1 = (size_t *)
                       ((long)&plVar7[(long)dVar25].
                               super__List_base<sStrand_*,_std::allocator<sStrand_*>_>._M_impl.
                               _M_node + 0x10);
              *psVar1 = *psVar1 + 1;
              *(long *)(local_3f8._0_8_ + (long)dVar25 * 0x18 + 0x10) =
                   *(long *)(local_3f8._0_8_ + (long)dVar25 * 0x18 + 0x10) + -1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(pcVar29,0x18);
LAB_00109351:
              iVar14 = iVar14 + 1;
            } while (iVar14 != iVar13);
          }
          iVar13 = 0;
        }
      }
    } while (((iVar13 == 0x1e) || (iVar13 == 0)) &&
            (dVar25 = (double)(ulong)(SUB84(local_460,0) + 1),
            dVar20 = (double)(((long)(local_3f8._8_8_ - local_3f8._0_8_) >> 3) * -0x5555555555555555
                             ), (ulong)dVar25 <= (ulong)dVar20 && (long)dVar20 - (long)dVar25 != 0))
    ;
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::~vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
             *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Network::Network(class NetwMin *netw_min, std::string filename) {

      int nnodes = 0, nstrands = 0, atoms_line_start = 0, bonds_line_start = 0,
              bond_coeffs_line_start = 0, masses_line_start = 0, pair_coeffs_line_start = 0,
              atom_types_line = 0, bond_types_line = 0, ihelp;

      nstrands = 0;
      cout << "#: Initializing network.\n";
      /* Define and open the desired file. */
      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;
      std::vector <string> tokens;

      /* Read and search file. */
      int iline = 0;

      while (data_file.good()) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);

         if (current_line.find("atoms") != string::npos)
            nnodes = atoi(current_line.c_str());
         if (current_line.find("bonds") != string::npos)
            nstrands = atoi(current_line.c_str());
         if (current_line.find("Atoms") != string::npos)
            atoms_line_start = iline;
         if (current_line.find("Bonds") != string::npos)
            bonds_line_start = iline;
         if (current_line.find("Masses") != string::npos)
            masses_line_start = iline;
         if ((current_line.find("Bond") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            bond_coeffs_line_start = iline;
         if ((current_line.find("Pair") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            pair_coeffs_line_start = iline;
         if ((current_line.find("atom") != string::npos)
                 && (current_line.find("types") != string::npos))
            atom_types_line = iline;
         if ((current_line.find("bond") != string::npos)
                 && (current_line.find("types") != string::npos))
            bond_types_line = iline;

         iline++;
      }
      data_file.close();

      /* Read the masses of the nodes from the corresponding session of the data file. */
      tokens = tokenize(lines_of_file[atom_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bead types: " << ihelp << " .\n";
      node_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++) {
         tokens = tokenize(lines_of_file[masses_line_start + i + 2]);
         node_types[i].n_mass = atof(tokens[1].c_str());
         node_types[i].mass = atof(tokens[2].c_str());

         tokens = tokenize(lines_of_file[pair_coeffs_line_start+i+2]);
         node_types[i].r_node = atof(tokens[1].c_str());
      }

      /* Read the bond coefficients from the corresponding section of the data file. */
      tokens = tokenize(lines_of_file[bond_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bond types: " << ihelp << " .\n";
      bond_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++){
         tokens = tokenize(lines_of_file[bond_coeffs_line_start + i + 2]);
         bond_types[i].spring_coeff = atof(tokens[1].c_str());
         bond_types[i].sq_ete = atof(tokens[2].c_str());
         bond_types[i].kuhnl = atof(tokens[3].c_str());
      }

      /* Read atom sections which corresponds to nodal points: */
      for (int i = 0; i < nnodes; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[atoms_line_start + 2 + i]);

         
         //int pbcx = atoi(tokens[7].c_str());
         //int pbcy = atoi(tokens[8].c_str());
         //int pbcz = atoi(tokens[9].c_str());
         
         /* Set the attributes of the current node object. */
         tNode current_node;
         current_node.Id = atoi(tokens[0].c_str());
         current_node.Type = atoi(tokens[2].c_str());
         current_node.Pos[0] = atof(tokens[4].c_str()); //+ (double)pbcx*netw_min->domain->XBoxLen;
         current_node.Pos[1] = atof(tokens[5].c_str()); //+ (double)pbcy*netw_min->domain->YBoxLen;
         current_node.Pos[2] = atof(tokens[6].c_str()); //+ (double)pbcz*netw_min->domain->ZBoxLen;
         current_node.node_cell = 0;

         // Read the mass of the nodal point from the "Masses" section of the file.
         current_node.n_mass = node_types[current_node.Type-1].n_mass;
         current_node.mass = node_types[current_node.Type-1].mass;

         /* Pair coeffs come from the data file in Angstrom. */
         current_node.r_node = node_types[current_node.Type-1].r_node;
         current_node.r_star = current_node.r_node;

         nodes.push_back(current_node);
      }
      cout << "#: --- " << nnodes << " nodes have been added to the network structure.\n";


      int nchains = 0;

      for (int i = 0; i < nstrands; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[bonds_line_start + 2 + i]);
         
         /* Create a temporary object: */
         tStrand current_strand;
         current_strand.Id = atoi(tokens[0].c_str());
         current_strand.Type = atoi(tokens[1].c_str());
         current_strand.OrChain = atoi(tokens[5].c_str());
         if (current_strand.OrChain > nchains)
            nchains = current_strand.OrChain;

         if (current_strand.OrChain == 0)
            current_strand.slip_spring = true;
         else
            current_strand.slip_spring = false;

         /* Read the tags of the start and the end of the strand. */
         int snode = atoi(tokens[2].c_str());
         int enode = atoi(tokens[3].c_str());

         if (snode > (nnodes) || enode > (nnodes)){
            cout << ": --- There is a problem at line: " << (bonds_line_start + 2 + i + 1) 
                 << " of the data file.\n" << lines_of_file[bonds_line_start + 2 + i] << "\n";
            exit(0);
         }
         
         /* We have to find the nodal point whose tag is equal to snode: */
         int found = 0;
         for (std::list <tNode>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
            if (found > 1)
               break;
            if ((*it).Id == snode || (*it).Id == enode) {
               found++;
               (*it).OrChains.push_back(current_strand.OrChain);
               current_strand.pEnds.push_back(&(*it));
            }
         }

         /* Spring coeffs comes from the data file in kJ/mol/K/A^2 */
         current_strand.spring_coeff = bond_types[current_strand.Type-1].spring_coeff;
         /* Length of the strand (n*b) comes from the data file in Angstroms. */
         current_strand.sq_end_to_end = bond_types[current_strand.Type-1].sq_ete;
         current_strand.kuhn_length = bond_types[current_strand.Type-1].kuhnl;

         /* Set the creation time of the slip-spring: */
         if (current_strand.slip_spring)
            current_strand.tcreation = 0;
         
         /* and push it back to the list: */
         strands.push_back(current_strand);

         /* 2013/04/09: Also, push back a pointer to the last element of "strands" vector, if 
          *             the inserted strand is a slip spring. */
         if (current_strand.slip_spring)
            pslip_springs.push_back(&(strands.back()));
      }



      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         /* 2013/04/09: We exclude slip strings from the local registry of strands connected to 
          *             a specific node. Array "pStrands" contains only chain strands, 
          *             not slip-springs!!. */
         if (!(*it).slip_spring) {
            (*it).pEnds[0]->pStrands.push_back(&(*it));
            (*it).pEnds[1]->pStrands.push_back(&(*it));
         }
      }

      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         if ((*it).slip_spring)
            continue;

         double dxr = (*it).pEnds[1]->Pos[0] - (*it).pEnds[0]->Pos[0];
         double dyr = (*it).pEnds[1]->Pos[1] - (*it).pEnds[0]->Pos[1];
         double dzr = (*it).pEnds[1]->Pos[2] - (*it).pEnds[0]->Pos[2];
         netw_min->domain->minimum_image(dxr, dyr, dzr);

         double dist = sqrt(dxr * dxr + dyr * dyr + dzr * dzr);
         if (dist - (*it).sq_end_to_end / (*it).kuhn_length > tol)
            cout << "Strand " << (*it).Id << " has length " << (*it).sq_end_to_end 
                  / (*it).kuhn_length << " but real dist " << dist << endl;

      }

      /* Categorize strands into chains: */
      std::vector<std::list<tStrand *> > chains(nchains);
      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it)
         if (!(*it).slip_spring)
            chains[(*it).OrChain - 1].push_back(&(*it));


      /* Loop over all chains: */
      sorted_chains.resize(nchains);

      for (unsigned int ich = 0; ich < chains.size(); ich++) {
         /* Search to find an end of the chain: */
         std::list <tStrand *>::iterator it, jt;
         jt = find_if(chains[ich].begin(), chains[ich].end(), pred_strand_is_end);
         if (jt == chains[ich].end()) {
            cout << "Chain with no ends was found: " << ich << " .\n";
            cout << "Number of strands: " << chains[ich].size() << " .\n";
            return;
         }

         if ((*jt)->pEnds[0]->Type != 1) {
            tNode *temp;
            temp = (*jt)->pEnds[0];
            (*jt)->pEnds[0] = (*jt)->pEnds[1];
            (*jt)->pEnds[1] = temp;
         }
         sorted_chains[ich].push_back((*jt));
         if (chains[ich].size() > 1)
            chains[ich].erase(jt);
         else
            continue;

         int nelems = chains[ich].size();
         for (int i = 0; i < nelems; i++) {
            /* Set the iterator to the end of the sorted list: */
            it = sorted_chains[ich].end();
            --it;

            /* Find the next element: */
            for (jt = chains[ich].begin(); jt != chains[ich].end(); ++jt) {
               /* check whether is connected to the preceeding strand: */
               if ((*jt)->pEnds[0] == (*it)->pEnds[1]) {
                  /* We can append the found strand as is: */
                  sorted_chains[ich].push_back((*jt));
                  /* an delete it from the previous list */
                  jt = chains[ich].erase(jt);
                  break;
               }

               if ((*jt)->pEnds[1] == (*it)->pEnds[1]) {
                  /* We have to change the order of the pointers. */
                  tNode *temp;
                  temp = (*jt)->pEnds[0];
                  (*jt)->pEnds[0] = (*jt)->pEnds[1];
                  (*jt)->pEnds[1] = temp;

                  /* And add it to the list: */
                  sorted_chains[ich].push_back((*jt));
                  jt = chains[ich].erase(jt);
                  break;
               }
            }
         }
      }


      return;
   }